

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
emplaceRealloc<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *this,pointer pos,
          CheckerInstanceBodySymbol *args,Symbol *args_1,ExpressionSyntax **args_2,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *args_3)

{
  undefined8 *puVar1;
  ulong uVar2;
  ExpressionSyntax *pEVar3;
  pointer p;
  pointer ppAVar4;
  size_t sVar5;
  pointer pCVar6;
  long lVar7;
  pointer pCVar8;
  long lVar9;
  pointer pCVar10;
  long lVar11;
  pointer pCVar12;
  pointer pCVar13;
  size_type sVar14;
  ulong uVar15;
  byte bVar16;
  
  bVar16 = 0;
  if (this->len == 0x1c71c71c71c71c7) {
    detail::throwLengthError();
  }
  uVar15 = this->len + 1;
  uVar2 = this->cap;
  if (uVar15 < uVar2 * 2) {
    uVar15 = uVar2 * 2;
  }
  if (0x1c71c71c71c71c7 - uVar2 < uVar2) {
    uVar15 = 0x1c71c71c71c71c7;
  }
  lVar11 = (long)pos - (long)this->data_;
  pCVar6 = (pointer)operator_new(uVar15 * 0x48);
  pEVar3 = *args_2;
  ppAVar4 = args_3->_M_ptr;
  sVar5 = (args_3->_M_extent)._M_extent_value;
  *(CheckerInstanceBodySymbol **)((long)pCVar6 + lVar11) = args;
  *(Symbol **)((long)pCVar6 + lVar11 + 8) = args_1;
  *(undefined8 *)((long)pCVar6 + lVar11 + 0x10) = 0;
  *(undefined1 *)((long)pCVar6 + lVar11 + 0x18) = 0;
  puVar1 = (undefined8 *)((long)pCVar6 + lVar11 + 0x20);
  *puVar1 = ppAVar4;
  puVar1[1] = sVar5;
  *(ExpressionSyntax **)((long)pCVar6 + lVar11 + 0x30) = pEVar3;
  *(undefined1 *)((long)pCVar6 + lVar11 + 0x40) = 0;
  p = this->data_;
  sVar14 = this->len;
  lVar7 = (long)p + (sVar14 * 0x48 - (long)pos);
  pCVar8 = p;
  pCVar10 = pCVar6;
  if (lVar7 == 0) {
    pCVar8 = pCVar6;
    pCVar10 = p;
    if (sVar14 != 0) {
      do {
        pCVar12 = pCVar10;
        pCVar13 = pCVar8;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          pCVar13->parent = pCVar12->parent;
          pCVar12 = (pointer)((long)pCVar12 + (ulong)bVar16 * -0x10 + 8);
          pCVar13 = (pointer)((long)pCVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        }
        pCVar10 = pCVar10 + 1;
        pCVar8 = pCVar8 + 1;
      } while (pCVar10 != pos);
    }
  }
  else {
    for (; pCVar8 != pos; pCVar8 = pCVar8 + 1) {
      pCVar12 = pCVar8;
      pCVar13 = pCVar10;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        pCVar13->parent = pCVar12->parent;
        pCVar12 = (pointer)((long)pCVar12 + (ulong)bVar16 * -0x10 + 8);
        pCVar13 = (pointer)((long)pCVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      pCVar10 = pCVar10 + 1;
    }
    memcpy((void *)((long)pCVar6 + lVar11 + 0x48),pos,((lVar7 - 0x48U) / 0x48) * 0x48 + 0x48);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar14 = this->len;
  }
  this->len = sVar14 + 1;
  this->cap = uVar15;
  this->data_ = pCVar6;
  return (pointer)((long)pCVar6 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}